

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::DefaultCreateFunction
          (JavascriptLibrary *this,ParseableFunctionInfo *functionInfo,int length,
          DynamicObject *prototype,PropertyId nameId)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  undefined4 *puVar4;
  JavascriptLibrary *this_00;
  ScriptFunction *value;
  Var pvVar5;
  ScriptFunction *function;
  PropertyId nameId_local;
  DynamicObject *prototype_local;
  int length_local;
  ParseableFunctionInfo *functionInfo_local;
  JavascriptLibrary *this_local;
  
  if (0xf < (uint)nameId) {
    pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                       (&(this->super_JavascriptLibraryBase).scriptContext);
    bVar2 = ScriptContext::IsTrackedPropertyId(pSVar3,nameId);
    if (bVar2) goto LAB_01172333;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                              ,0x1340,
                              "(nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId))"
                              ,
                              "nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId)"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_01172333:
  pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                     (&(this->super_JavascriptLibraryBase).scriptContext);
  this_00 = ScriptContext::GetLibrary(pSVar3);
  value = CreateScriptFunction(this_00,&functionInfo->super_FunctionProxy);
  pvVar5 = TaggedInt::ToVarUnchecked(length);
  (*(value->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(value,0xd1,pvVar5,2,0,0,0xf);
  AddMember(this,prototype,nameId,value);
  return;
}

Assistant:

void JavascriptLibrary::DefaultCreateFunction(ParseableFunctionInfo * functionInfo, int length, DynamicObject * prototype, PropertyId nameId)
    {
        Assert(nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId));
        ScriptFunction* function = scriptContext->GetLibrary()->CreateScriptFunction(functionInfo);
        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(length), PropertyConfigurable, nullptr);
        AddMember(prototype, nameId, function);
    }